

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O0

void __thiscall Gb_Wave::run(Gb_Wave *this,blip_time_t time,blip_time_t end_time,int playing)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  uint in_ECX;
  int in_EDX;
  int in_ESI;
  Gb_Osc *in_RDI;
  int delta_1;
  int amp_1;
  int wave_pos;
  int period;
  Blip_Buffer *output;
  int delta;
  int amp;
  int frequency;
  int volume_shift;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_38;
  uint local_20;
  uint local_14;
  int local_c;
  
  bVar4 = (char)in_RDI->volume - 1U & 7;
  local_20 = ((int)(uint)*(byte *)((long)in_RDI[1].outputs +
                                  (long)*(int *)(in_RDI[1].outputs + 1) + 0xc) >> bVar4 & in_ECX) <<
             1;
  iVar1 = Gb_Osc::frequency(in_RDI);
  local_14 = in_ECX;
  if (0x7fc < iVar1 - 1U) {
    local_20 = 0x1e >> bVar4 & in_ECX;
    local_14 = 0;
  }
  if (local_20 != in_RDI->last_amp) {
    in_RDI->last_amp = local_20;
    Blip_Synth<8,_1>::offset
              ((Blip_Synth<8,_1> *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (blip_time_t)((ulong)in_RDI >> 0x20),(int)in_RDI,(Blip_Buffer *)0x81ffec);
  }
  local_c = in_RDI->delay + in_ESI;
  if (local_14 == 0) {
    local_c = in_EDX;
  }
  if (local_c < in_EDX) {
    local_38 = *(int *)(in_RDI[1].outputs + 1) + 1U & 0x1f;
    do {
      iVar2 = ((int)(uint)*(byte *)((long)in_RDI[1].outputs + (long)(int)local_38 + 0xc) >> bVar4) *
              2;
      local_38 = local_38 + 1 & 0x1f;
      iVar3 = iVar2 - in_RDI->last_amp;
      if (iVar3 != 0) {
        in_RDI->last_amp = iVar2;
        Blip_Synth<8,_1>::offset_inline
                  ((Blip_Synth<8,_1> *)CONCAT44(iVar2,iVar3),(blip_time_t)((ulong)in_RDI >> 0x20),
                   (int)in_RDI,(Blip_Buffer *)0x8200a0);
      }
      local_c = (0x800 - iVar1) * 2 + local_c;
    } while (local_c < in_EDX);
    *(uint *)(in_RDI[1].outputs + 1) = local_38 - 1 & 0x1f;
  }
  in_RDI->delay = local_c - in_EDX;
  return;
}

Assistant:

void Gb_Wave::run( blip_time_t time, blip_time_t end_time, int playing )
{
	int volume_shift = (volume - 1) & 7; // volume = 0 causes shift = 7
	int frequency;
	{
		int amp = (wave [wave_pos] >> volume_shift & playing) * 2;
		
		frequency = this->frequency();
		if ( unsigned (frequency - 1) > 2044 ) // frequency < 1 || frequency > 2045
		{
			amp = 30 >> volume_shift & playing;
			playing = false;
		}
		
		int delta = amp - last_amp;
		if ( delta )
		{
			last_amp = amp;
			synth->offset( time, delta, output );
		}
	}
	
	time += delay;
	if ( !playing )
		time = end_time;
	
	if ( time < end_time )
	{
		Blip_Buffer* const output = this->output;
		int const period = (2048 - frequency) * 2;
	 	int wave_pos = (this->wave_pos + 1) & (wave_size - 1);
	 	
		do
		{
			int amp = (wave [wave_pos] >> volume_shift) * 2;
			wave_pos = (wave_pos + 1) & (wave_size - 1);
			int delta = amp - last_amp;
			if ( delta )
			{
				last_amp = amp;
				synth->offset_inline( time, delta, output );
			}
			time += period;
		}
		while ( time < end_time );
		
		this->wave_pos = (wave_pos - 1) & (wave_size - 1);
	}
	delay = time - end_time;
}